

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O1

hash_code llvm::hashing::detail::
          hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     first,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           last)

{
  long lVar1;
  long lVar2;
  hash_code hVar3;
  size_t sVar4;
  size_t length;
  uchar *length_00;
  uchar *puVar5;
  char buffer [64];
  hash_state state;
  uchar local_a8 [64];
  hash_state local_68;
  
  if (get_execution_seed()::seed == '\0') {
    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ();
  }
  if (first._M_current == last._M_current) {
    length = 0;
  }
  else {
    sVar4 = 0;
    do {
      length = sVar4;
      if (0x3f < (long)sVar4) break;
      length = sVar4 + 1;
      local_a8[sVar4] = *first._M_current;
      first._M_current = first._M_current + 1;
      sVar4 = length;
    } while (first._M_current != last._M_current);
  }
  if (first._M_current == last._M_current) {
    hVar3.value = hash_short((char *)local_a8,length,get_execution_seed()::seed);
  }
  else {
    if (length != 0x40) {
      __assert_fail("buffer_ptr == buffer_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Hashing.h"
                    ,0x1a0,
                    "hash_code llvm::hashing::detail::hash_combine_range_impl(InputIteratorT, InputIteratorT) [InputIteratorT = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
                   );
    }
    hash_state::create((hash_state *)(local_a8 + 0x40),(char *)local_a8,get_execution_seed()::seed);
    length_00 = (uchar *)0x40;
    if (first._M_current != last._M_current) {
      do {
        lVar2 = 0;
        puVar5 = local_a8;
        do {
          lVar1 = lVar2;
          if (0x3f < lVar2) break;
          lVar1 = lVar2 + 1;
          *puVar5 = *first._M_current;
          first._M_current = first._M_current + 1;
          puVar5 = local_a8 + lVar2 + 1;
          lVar2 = lVar1;
        } while (first._M_current != last._M_current);
        std::_V2::__rotate<char*>(local_a8,local_a8 + lVar1,local_a8 + 0x40);
        hash_state::mix((hash_state *)(local_a8 + 0x40),(char *)local_a8);
        length_00 = local_a8 + lVar1 + ((long)length_00 - (long)local_a8);
      } while (first._M_current != last._M_current);
    }
    hVar3.value = hash_state::finalize((hash_state *)(local_a8 + 0x40),(size_t)length_00);
  }
  return (hash_code)hVar3.value;
}

Assistant:

hash_code hash_combine_range_impl(InputIteratorT first, InputIteratorT last) {
  const uint64_t seed = get_execution_seed();
  char buffer[64], *buffer_ptr = buffer;
  char *const buffer_end = std::end(buffer);
  while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                            get_hashable_data(*first)))
    ++first;
  if (first == last)
    return hash_short(buffer, buffer_ptr - buffer, seed);
  assert(buffer_ptr == buffer_end);

  hash_state state = state.create(buffer, seed);
  size_t length = 64;
  while (first != last) {
    // Fill up the buffer. We don't clear it, which re-mixes the last round
    // when only a partial 64-byte chunk is left.
    buffer_ptr = buffer;
    while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                              get_hashable_data(*first)))
      ++first;

    // Rotate the buffer if we did a partial fill in order to simulate doing
    // a mix of the last 64-bytes. That is how the algorithm works when we
    // have a contiguous byte sequence, and we want to emulate that here.
    std::rotate(buffer, buffer_ptr, buffer_end);

    // Mix this chunk into the current state.
    state.mix(buffer);
    length += buffer_ptr - buffer;
  };

  return state.finalize(length);
}